

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_y.c
# Opt level: O0

void test_option_y(void)

{
  wchar_t wVar1;
  ulong local_20;
  size_t s;
  char *pcStack_10;
  int r;
  char *p;
  
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_y.c"
                      ,L'\x10',"f",L'Ƥ',L'\xffffffff',"a");
  s._4_4_ = systemf("echo f | %s -oy >archive.out 2>archive.err",testprog);
  pcStack_10 = slurpfile(&local_20,"archive.err");
  free(pcStack_10);
  if (s._4_4_ == L'\0') {
    assertion_text_file_contents
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_y.c"
               ,L' ',"1 block\n","archive.err");
    pcStack_10 = slurpfile(&local_20,"archive.out");
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_y.c"
                     ,L'#',(uint)(2 < local_20),"s > 2",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_y.c"
                        ,L'$',pcStack_10,"p","BZh9","\"BZh9\"",4,"4",(void *)0x0);
    free(pcStack_10);
  }
  else {
    wVar1 = canBzip2();
    if (wVar1 == L'\0') {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_y.c"
                     ,L'\x19');
      test_skipping("bzip2 is not supported on this platform");
    }
    else {
      failure("-y option is broken");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_y.c"
                          ,L'\x1d',(long)s._4_4_,"r",0,"0",(void *)0x0);
    }
  }
  return;
}

Assistant:

DEFINE_TEST(test_option_y)
{
	char *p;
	int r;
	size_t s;

	/* Create a file. */
	assertMakeFile("f", 0644, "a");

	/* Archive it with bzip2 compression. */
	r = systemf("echo f | %s -oy >archive.out 2>archive.err",
	    testprog);
	p = slurpfile(&s, "archive.err");
	free(p);
	if (r != 0) {
		if (!canBzip2()) {
			skipping("bzip2 is not supported on this platform");
			return;
		}
		failure("-y option is broken");
		assertEqualInt(r, 0);
		return;
	}
	assertTextFileContents("1 block\n", "archive.err");
	/* Check that the archive file has a bzip2 signature. */
	p = slurpfile(&s, "archive.out");
	assert(s > 2);
	assertEqualMem(p, "BZh9", 4);
	free(p);
}